

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.cc
# Opt level: O3

void __thiscall leveldb::VersionSet::~VersionSet(VersionSet *this)

{
  Writer *this_00;
  pointer pcVar1;
  long lVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  
  Version::Unref(this->current_);
  if ((this->dummy_versions_).next_ != &this->dummy_versions_) {
    __assert_fail("dummy_versions_.next_ == &dummy_versions_",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/version_set.cc"
                  ,0x308,"leveldb::VersionSet::~VersionSet()");
  }
  this_00 = this->descriptor_log_;
  if (this_00 != (Writer *)0x0) {
    log::Writer::~Writer(this_00);
  }
  operator_delete(this_00);
  if (this->descriptor_file_ != (WritableFile *)0x0) {
    (*this->descriptor_file_->_vptr_WritableFile[1])();
  }
  paVar3 = &this->compact_pointer_[6].field_2;
  lVar2 = -0xe0;
  do {
    pcVar1 = (((string *)(paVar3 + -1))->_M_dataplus)._M_p;
    if (paVar3 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)pcVar1) {
      operator_delete(pcVar1);
    }
    paVar3 = paVar3 + -2;
    lVar2 = lVar2 + 0x20;
  } while (lVar2 != 0);
  Version::~Version(&this->dummy_versions_);
  Comparator::~Comparator(&(this->icmp_).super_Comparator);
  pcVar1 = (this->dbname_)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->dbname_).field_2) {
    operator_delete(pcVar1);
    return;
  }
  return;
}

Assistant:

VersionSet::~VersionSet() {
  current_->Unref();
  assert(dummy_versions_.next_ == &dummy_versions_);  // List must be empty
  delete descriptor_log_;
  delete descriptor_file_;
}